

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLAbstractDoubleFloat::formatString(XMLAbstractDoubleFloat *this)

{
  LiteralType LVar1;
  XMLCh *pXVar2;
  int iVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  ulong local_20;
  XMLSize_t i;
  XMLSize_t rawDataLen;
  XMLAbstractDoubleFloat *this_local;
  
  XVar4 = XMLString::stringLen(this->fRawData);
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(XVar4 + 8) * 2);
  this->fFormattedString = (XMLCh *)CONCAT44(extraout_var,iVar3);
  for (local_20 = 0; local_20 < XVar4 + 8; local_20 = local_20 + 1) {
    this->fFormattedString[local_20] = L'\0';
  }
  XMLString::copyString(this->fFormattedString,this->fRawData);
  this->fFormattedString[XVar4] = L' ';
  this->fFormattedString[XVar4 + 1] = L'(';
  LVar1 = this->fType;
  if (LVar1 == NegINF) {
    XMLString::catString(this->fFormattedString,(XMLCh *)XMLUni::fgNegINFString);
  }
  else if (LVar1 == PosINF) {
    XMLString::catString(this->fFormattedString,L"INF");
  }
  else if (LVar1 == NaN) {
    XMLString::catString(this->fFormattedString,L"NaN");
  }
  else {
    XMLString::catString(this->fFormattedString,L"0");
  }
  pXVar2 = this->fFormattedString;
  XVar4 = XMLString::stringLen(this->fFormattedString);
  pXVar2[XVar4] = L')';
  return;
}

Assistant:

void XMLAbstractDoubleFloat::formatString()
{

    XMLSize_t rawDataLen = XMLString::stringLen(fRawData);
    fFormattedString = (XMLCh*) fMemoryManager->allocate
    (
        (rawDataLen + 8) * sizeof(XMLCh)
    );//new XMLCh [ rawDataLen + 8];
    for (XMLSize_t i = 0; i < rawDataLen + 8; i++)
        fFormattedString[i] = chNull;

    XMLString::copyString(fFormattedString, fRawData);

    fFormattedString[rawDataLen] = chSpace;
    fFormattedString[rawDataLen + 1] = chOpenParen;

    switch (fType)
    {
    case NegINF:       
        XMLString::catString(fFormattedString, XMLUni::fgNegINFString);
        break;
    case PosINF:
        XMLString::catString(fFormattedString, XMLUni::fgPosINFString);
        break;
    case NaN:
        XMLString::catString(fFormattedString, XMLUni::fgNaNString);
        break;
    default:
        // its zero
        XMLString::catString(fFormattedString, XMLUni::fgPosZeroString);
        break;
    }

    fFormattedString[XMLString::stringLen(fFormattedString)] = chCloseParen;

}